

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_test.cpp
# Opt level: O3

void __thiscall Image_GetSetBGR_Test::~Image_GetSetBGR_Test(Image_GetSetBGR_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Image, GetSetBGR) {
    Point2i res(7, 32);
    pstd::vector<float> rgbPixels = GetFloatPixels(res, 3);

    for (auto format : {PixelFormat::U256, PixelFormat::Half, PixelFormat::Float}) {
        Image image(format, res, {"R", "G", "B"}, ColorEncodingHandle::Linear);
        for (int y = 0; y < res[1]; ++y)
            for (int x = 0; x < res[0]; ++x)
                for (int c = 0; c < 3; ++c)
                    image.SetChannel({x, y}, c, rgbPixels[3 * y * res[0] + 3 * x + c]);

        ImageChannelDesc bgrDesc = image.GetChannelDesc({"B", "G", "R"});
        EXPECT_TRUE(bool(bgrDesc));

        for (int y = 0; y < res[1]; ++y)
            for (int x = 0; x < res[0]; ++x) {
                ImageChannelValues rgb = image.GetChannels({x, y});
                EXPECT_EQ(3, rgb.size());

                ImageChannelValues bgr = image.GetChannels({x, y}, bgrDesc);
                EXPECT_EQ(rgb[0], bgr[2]);
                EXPECT_EQ(rgb[1], bgr[1]);
                EXPECT_EQ(rgb[2], bgr[0]);

                for (int c = 0; c < 3; ++c) {
                    EXPECT_EQ(rgb[c], image.GetChannel({x, y}, c));
                    int offset = 3 * y * res[0] + 3 * x + c;
                    if (format == PixelFormat::U256)
                        EXPECT_LT(std::abs(rgb[c] - Clamp(rgbPixels[offset], 0, 1)),
                                  0.501f / 255.f);
                    else {
                        Float qv = modelQuantization(rgbPixels[offset], format);
                        EXPECT_EQ(rgb[c], qv);
                    }
                }
            }
    }
}